

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_helpers.cc
# Opt level: O1

int google::protobuf::compiler::java::GetExperimentalJavaFieldType(FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  byte bVar2;
  char cVar3;
  JavaType JVar4;
  long lVar5;
  Descriptor *type;
  FieldDescriptor *pFVar6;
  LogMessage *this;
  string *psVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  LogMessageFatal aLStack_28 [16];
  
  bVar2 = google::protobuf::FieldDescriptor::is_required();
  uVar11 = (uint)bVar2 * 0x100;
  uVar12 = uVar11;
  if (field[2] == (FieldDescriptor)0x9) {
    lVar5 = google::protobuf::internal::ExtensionSet::GetMessage
                      ((int)*(undefined8 *)(field + 0x48) + 0x10,(MessageLite *)(ulong)pb::java);
    cVar3 = '\x01';
    if ((*(int *)(lVar5 + 0x1c) != 2) && (*(int *)(*(long *)(field + 0x48) + 0x3c) != 2)) {
      cVar3 = *(char *)(*(long *)(*(long *)(field + 0x10) + 0x80) + 0xa2);
    }
    uVar12 = uVar11 + 0x200;
    if (cVar3 == '\0') {
      uVar12 = uVar11;
    }
  }
  cVar3 = google::protobuf::FieldDescriptor::is_required();
  if (cVar3 == '\0') {
    JVar4 = GetJavaType(field);
    if (JVar4 == JAVATYPE_MESSAGE) {
      type = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
      bVar8 = HasRequiredFields(type);
      if (bVar8) goto LAB_0028ded3;
    }
  }
  else {
LAB_0028ded3:
    uVar12 = uVar12 | 0x400;
  }
  cVar3 = google::protobuf::internal::cpp::HasHasbit(field);
  uVar11 = uVar12 + 0x1000;
  if (cVar3 == '\0') {
    uVar11 = uVar12;
  }
  JVar4 = GetJavaType(field);
  if (JVar4 == JAVATYPE_ENUM) {
    lVar5 = google::protobuf::internal::ExtensionSet::GetMessage
                      ((int)*(undefined8 *)(field + 0x48) + 0x10,(MessageLite *)(ulong)pb::java);
    if ((*(char *)(lVar5 + 0x18) == '\0') &&
       (lVar5 = google::protobuf::FieldDescriptor::enum_type(), lVar5 != 0)) {
      google::protobuf::FieldDescriptor::enum_type();
      bVar2 = google::protobuf::EnumDescriptor::is_closed();
      bVar2 = bVar2 ^ 1;
    }
    else {
      bVar2 = 0;
    }
    if (bVar2 == 0) {
      uVar11 = uVar11 | 0x800;
    }
  }
  if ((field[2] != (FieldDescriptor)0xb) ||
     (cVar3 = google::protobuf::FieldDescriptor::is_map_message_type(), cVar3 == '\0')) {
    cVar3 = google::protobuf::FieldDescriptor::is_packed();
    if (cVar3 == '\0') {
      FVar1 = field[1];
      bVar8 = (bool)(((byte)FVar1 & 0x20) >> 5);
      if (0xbf < (byte)FVar1 == bVar8) {
        psVar7 = (string *)0x0;
      }
      else {
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar8,0xbf < (byte)FVar1,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar7 != (string *)0x0) {
        GetExperimentalJavaFieldType();
        goto LAB_0028e128;
      }
      if (((byte)field[1] & 0x20) == 0) {
        bVar8 = IsRealOneof(field);
        FVar1 = field[2];
        uVar9 = (uint)(byte)FVar1;
        if (bVar8) {
          iVar10 = 0x11;
          if (uVar9 != 10) {
            if ((byte)FVar1 < 10) {
              iVar10 = uVar9 - 1;
            }
            else {
              iVar10 = uVar9 - 2;
            }
          }
          uVar12 = iVar10 + 0x33;
        }
        else {
          uVar12 = 0x11;
          if (uVar9 != 10) {
            if ((byte)FVar1 < 10) {
              uVar12 = uVar9 - 1;
            }
            else {
              uVar12 = uVar9 - 2;
            }
          }
        }
      }
      else {
        FVar1 = field[2];
        uVar12 = 0x31;
        if (FVar1 != (FieldDescriptor)0xa) {
          uVar12 = (byte)FVar1 + 0x12 + ((byte)FVar1 < 10 | 0xfffffffe);
        }
      }
    }
    else {
      FVar1 = field[2];
      iVar10 = 0x22;
      if ((8 < (byte)FVar1) && (iVar10 = 0x1e, (byte)FVar1 < 0xd)) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (aLStack_28,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/java/internal_helpers.cc"
                   ,0x47);
        this = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<
                         ((LogMessage *)aLStack_28,(string *)(*(long *)(field + 8) + 0x20));
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  (this,(char (*) [18])" can\'t be packed.");
LAB_0028e128:
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
      }
      uVar12 = iVar10 + (uint)(byte)FVar1;
    }
    return uVar12 | uVar11;
  }
  pFVar6 = MapValueField(field);
  lVar5 = google::protobuf::internal::ExtensionSet::GetMessage
                    ((int)*(undefined8 *)(pFVar6 + 0x48) + 0x10,(MessageLite *)(ulong)pb::java);
  if ((*(char *)(lVar5 + 0x18) == '\0') &&
     (lVar5 = google::protobuf::FieldDescriptor::enum_type(), lVar5 != 0)) {
    google::protobuf::FieldDescriptor::enum_type();
    cVar3 = google::protobuf::EnumDescriptor::is_closed();
    if (cVar3 == '\0') goto LAB_0028dff7;
  }
  google::protobuf::FieldDescriptor::message_type();
  pFVar6 = (FieldDescriptor *)google::protobuf::Descriptor::map_value();
  JVar4 = GetJavaType(pFVar6);
  if (JVar4 == JAVATYPE_ENUM) {
    uVar11 = uVar11 | 0x800;
  }
LAB_0028dff7:
  return uVar11 | 0x32;
}

Assistant:

int GetExperimentalJavaFieldType(const FieldDescriptor* field) {
  static const int kMapFieldType = 50;
  static const int kOneofFieldTypeOffset = 51;

  static const int kRequiredBit = 0x100;
  static const int kUtf8CheckBit = 0x200;
  static const int kCheckInitialized = 0x400;
  static const int kLegacyEnumIsClosedBit = 0x800;
  static const int kHasHasBit = 0x1000;
  int extra_bits = field->is_required() ? kRequiredBit : 0;
  if (field->type() == FieldDescriptor::TYPE_STRING && CheckUtf8(field)) {
    extra_bits |= kUtf8CheckBit;
  }
  if (field->is_required() || (GetJavaType(field) == JAVATYPE_MESSAGE &&
                               HasRequiredFields(field->message_type()))) {
    extra_bits |= kCheckInitialized;
  }
  if (HasHasbit(field)) {
    extra_bits |= kHasHasBit;
  }
  if (GetJavaType(field) == JAVATYPE_ENUM && !SupportUnknownEnumValue(field)) {
    extra_bits |= kLegacyEnumIsClosedBit;
  }

  if (field->is_map()) {
    if (!SupportUnknownEnumValue(MapValueField(field))) {
      const FieldDescriptor* value = field->message_type()->map_value();
      if (GetJavaType(value) == JAVATYPE_ENUM) {
        extra_bits |= kLegacyEnumIsClosedBit;
      }
    }
    return kMapFieldType | extra_bits;
  } else if (field->is_packed()) {
    return GetExperimentalJavaFieldTypeForPacked(field) | extra_bits;
  } else if (field->is_repeated()) {
    return GetExperimentalJavaFieldTypeForRepeated(field) | extra_bits;
  } else if (IsRealOneof(field)) {
    return (GetExperimentalJavaFieldTypeForSingular(field) +
            kOneofFieldTypeOffset) |
           extra_bits;
  } else {
    return GetExperimentalJavaFieldTypeForSingular(field) | extra_bits;
  }
}